

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rply.cpp
# Opt level: O0

void ply_property_init(p_ply_property_conflict property)

{
  p_ply_property_conflict property_local;
  
  property->name[0] = '\0';
  property->type = ~PLY_INT8;
  property->length_type = ~PLY_INT8;
  property->value_type = ~PLY_INT8;
  property->read_cb = (p_ply_read_cb)0x0;
  property->pdata = (void *)0x0;
  property->idata = 0;
  return;
}

Assistant:

static void ply_property_init(p_ply_property property) {
    property->name[0] = '\0';
    property->type = (e_ply_type)-1;
    property->length_type = (e_ply_type)-1;
    property->value_type = (e_ply_type)-1;
    property->read_cb = (p_ply_read_cb)NULL;
    property->pdata = NULL;
    property->idata = 0;
}